

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall
Fossilize::StateRecorder::Impl::register_on_use(Impl *this,ResourceTag tag,Hash hash)

{
  uint uVar1;
  time_t local_28;
  uint64_t t;
  Hash hash_local;
  Impl *pIStack_10;
  ResourceTag tag_local;
  Impl *this_local;
  
  if ((((this->record_data).write_database_entries & 1U) != 0) &&
     (this->on_use_database_iface != (DatabaseInterface *)0x0)) {
    t = hash;
    hash_local._4_4_ = tag;
    pIStack_10 = this;
    uVar1 = (*this->on_use_database_iface->_vptr_DatabaseInterface[5])
                      (this->on_use_database_iface,(ulong)tag,hash);
    if ((uVar1 & 1) == 0) {
      local_28 = time((time_t *)0x0);
      (*this->on_use_database_iface->_vptr_DatabaseInterface[4])
                (this->on_use_database_iface,(ulong)hash_local._4_4_,t,&local_28,8,8);
    }
  }
  return;
}

Assistant:

void StateRecorder::Impl::register_on_use(ResourceTag tag, Hash hash) const
{
	if (record_data.write_database_entries && on_use_database_iface &&
	    !on_use_database_iface->has_entry(tag, hash))
	{
		uint64_t t = time(nullptr);
		on_use_database_iface->write_entry(tag, hash, &t, sizeof(t), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);
	}
}